

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O1

void Test_CheckNOTNULL_Simple::RunTest(void)

{
  undefined *puVar1;
  bool bVar2;
  int iVar3;
  void **ppvVar4;
  void *extraout_RAX;
  ostream *poVar5;
  void *ptr;
  int64 t;
  LogMessage LStack_5b0;
  LogMessage LStack_5a0;
  LogMessage LStack_590;
  LogMessage LStack_580;
  LogMessage LStack_570;
  LogMessage LStack_560;
  LogMessage LStack_550;
  LogMessage LStack_540;
  LogMessage LStack_530;
  LogMessage LStack_520;
  LogMessage LStack_510;
  LogMessage LStack_500;
  LogMessage LStack_4f0;
  LogMessage LStack_4e0;
  LogMessage LStack_4d0;
  LogMessage LStack_4c0;
  LogMessage LStack_4b0;
  string sStack_4a0;
  string sStack_480;
  string sStack_460;
  string sStack_440;
  string sStack_420;
  string sStack_400;
  string sStack_3e0;
  string sStack_3c0;
  string sStack_3a0;
  string sStack_380;
  string sStack_360;
  string sStack_340;
  string sStack_320;
  string sStack_300;
  string sStack_2e0;
  string sStack_2c0;
  string sStack_2a0;
  string sStack_280;
  string sStack_260;
  string sStack_240;
  string sStack_220;
  string sStack_200;
  string sStack_1e0;
  string sStack_1c0;
  string sStack_1a0;
  string sStack_180;
  string sStack_160;
  string sStack_140;
  string sStack_120;
  string sStack_100;
  string sStack_e0;
  string sStack_c0;
  string sStack_a0;
  string sStack_80;
  undefined **ppuStack_60;
  void *pvStack_40;
  long **pplStack_38;
  long *local_28;
  long *local_20;
  long local_18;
  
  local_20 = &local_18;
  ppvVar4 = google::CheckNotNull<void*&>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                       ,0x260,"\'ptr\' Must be non NULL",&local_20);
  if (local_20 == (long *)*ppvVar4) {
    local_28 = local_20;
    google::CheckNotNull<char*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x262,"\'reinterpret_cast<char *>(ptr)\' Must be non NULL",(char **)&local_28);
    local_28 = local_20;
    google::CheckNotNull<unsigned_char*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x263,"\'reinterpret_cast<unsigned char *>(ptr)\' Must be non NULL",
               (uchar **)&local_28);
    local_28 = local_20;
    google::CheckNotNull<int*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x264,"\'reinterpret_cast<int *>(ptr)\' Must be non NULL",(int **)&local_28);
    local_28 = local_20;
    google::CheckNotNull<long*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x265,"\'reinterpret_cast<int64 *>(ptr)\' Must be non NULL",&local_28);
    return;
  }
  RunTest();
  puVar1 = google::g_logging_fail_func;
  google::g_called_abort = '\0';
  google::g_logging_fail_func = google::CalledAbort;
  pvStack_40 = extraout_RAX;
  pplStack_38 = &local_20;
  iVar3 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
  if (iVar3 == 0) {
    pvStack_40 = (void *)0x0;
    google::CheckNotNull<void*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x269,"\'static_cast<void *>(NULL)\' Must be non NULL",&pvStack_40);
  }
  google::g_logging_fail_func = puVar1;
  if (google::g_called_abort != '\0') {
    return;
  }
  Test_DeathCheckNN_Simple::RunTest();
  ppuStack_60 = &google::g_logging_fail_func;
  sStack_80._M_dataplus._M_p = (pointer)&sStack_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_80,"foo","");
  sStack_2a0._M_dataplus._M_p = (pointer)&sStack_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_2a0,"foo","");
  bVar2 = WrapSafeFNMatch(&sStack_80,&sStack_2a0);
  if (!bVar2) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_4b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x36e);
    poVar5 = google::LogMessage::stream(&LStack_4b0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Check failed: WrapSafeFNMatch(\"foo\", \"foo\") ",0x2c);
    if (!bVar2) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_4b0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_2a0._M_dataplus._M_p != &sStack_2a0.field_2) {
    operator_delete(sStack_2a0._M_dataplus._M_p,sStack_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_80._M_dataplus._M_p != &sStack_80.field_2) {
    operator_delete(sStack_80._M_dataplus._M_p,sStack_80.field_2._M_allocated_capacity + 1);
  }
  sStack_a0._M_dataplus._M_p = (pointer)&sStack_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_a0,"foo","");
  sStack_2c0._M_dataplus._M_p = (pointer)&sStack_2c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_2c0,"bar","");
  bVar2 = WrapSafeFNMatch(&sStack_a0,&sStack_2c0);
  if (bVar2) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_4c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x36f);
    poVar5 = google::LogMessage::stream(&LStack_4c0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Check failed: !WrapSafeFNMatch(\"foo\", \"bar\") ",0x2d);
    if (bVar2) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_4c0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_2c0._M_dataplus._M_p != &sStack_2c0.field_2) {
    operator_delete(sStack_2c0._M_dataplus._M_p,sStack_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_a0._M_dataplus._M_p != &sStack_a0.field_2) {
    operator_delete(sStack_a0._M_dataplus._M_p,sStack_a0.field_2._M_allocated_capacity + 1);
  }
  sStack_c0._M_dataplus._M_p = (pointer)&sStack_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_c0,"foo","");
  sStack_2e0._M_dataplus._M_p = (pointer)&sStack_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_2e0,"fo","");
  bVar2 = WrapSafeFNMatch(&sStack_c0,&sStack_2e0);
  if (bVar2) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_4d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x370);
    poVar5 = google::LogMessage::stream(&LStack_4d0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Check failed: !WrapSafeFNMatch(\"foo\", \"fo\") ",0x2c);
    if (bVar2) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_4d0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_2e0._M_dataplus._M_p != &sStack_2e0.field_2) {
    operator_delete(sStack_2e0._M_dataplus._M_p,sStack_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_c0._M_dataplus._M_p != &sStack_c0.field_2) {
    operator_delete(sStack_c0._M_dataplus._M_p,sStack_c0.field_2._M_allocated_capacity + 1);
  }
  sStack_e0._M_dataplus._M_p = (pointer)&sStack_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_e0,"foo","");
  sStack_300._M_dataplus._M_p = (pointer)&sStack_300.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_300,"foo2","");
  bVar2 = WrapSafeFNMatch(&sStack_e0,&sStack_300);
  if (bVar2) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_4e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x371);
    poVar5 = google::LogMessage::stream(&LStack_4e0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Check failed: !WrapSafeFNMatch(\"foo\", \"foo2\") ",0x2e);
    if (bVar2) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_4e0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_300._M_dataplus._M_p != &sStack_300.field_2) {
    operator_delete(sStack_300._M_dataplus._M_p,sStack_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_e0._M_dataplus._M_p != &sStack_e0.field_2) {
    operator_delete(sStack_e0._M_dataplus._M_p,sStack_e0.field_2._M_allocated_capacity + 1);
  }
  sStack_100._M_dataplus._M_p = (pointer)&sStack_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_100,"bar/foo.ext","");
  sStack_320._M_dataplus._M_p = (pointer)&sStack_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_320,"bar/foo.ext","");
  bVar2 = WrapSafeFNMatch(&sStack_100,&sStack_320);
  if (!bVar2) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_4f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x372);
    poVar5 = google::LogMessage::stream(&LStack_4f0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Check failed: WrapSafeFNMatch(\"bar/foo.ext\", \"bar/foo.ext\") ",0x3c);
    if (!bVar2) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_4f0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_320._M_dataplus._M_p != &sStack_320.field_2) {
    operator_delete(sStack_320._M_dataplus._M_p,sStack_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_100._M_dataplus._M_p != &sStack_100.field_2) {
    operator_delete(sStack_100._M_dataplus._M_p,sStack_100.field_2._M_allocated_capacity + 1);
  }
  sStack_120._M_dataplus._M_p = (pointer)&sStack_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_120,"*ba*r/fo*o.ext*","");
  sStack_340._M_dataplus._M_p = (pointer)&sStack_340.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_340,"bar/foo.ext","");
  bVar2 = WrapSafeFNMatch(&sStack_120,&sStack_340);
  if (!bVar2) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_500,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x373);
    poVar5 = google::LogMessage::stream(&LStack_500);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Check failed: WrapSafeFNMatch(\"*ba*r/fo*o.ext*\", \"bar/foo.ext\") ",0x40);
    if (!bVar2) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_500);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_340._M_dataplus._M_p != &sStack_340.field_2) {
    operator_delete(sStack_340._M_dataplus._M_p,sStack_340.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_120._M_dataplus._M_p != &sStack_120.field_2) {
    operator_delete(sStack_120._M_dataplus._M_p,sStack_120.field_2._M_allocated_capacity + 1);
  }
  sStack_140._M_dataplus._M_p = (pointer)&sStack_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_140,"bar/foo.ext","");
  sStack_360._M_dataplus._M_p = (pointer)&sStack_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_360,"bar/baz.ext","");
  bVar2 = WrapSafeFNMatch(&sStack_140,&sStack_360);
  if (bVar2) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_510,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x374);
    poVar5 = google::LogMessage::stream(&LStack_510);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Check failed: !WrapSafeFNMatch(\"bar/foo.ext\", \"bar/baz.ext\") ",0x3d);
    if (bVar2) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_510);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_360._M_dataplus._M_p != &sStack_360.field_2) {
    operator_delete(sStack_360._M_dataplus._M_p,sStack_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_140._M_dataplus._M_p != &sStack_140.field_2) {
    operator_delete(sStack_140._M_dataplus._M_p,sStack_140.field_2._M_allocated_capacity + 1);
  }
  sStack_160._M_dataplus._M_p = (pointer)&sStack_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_160,"bar/foo.ext","");
  sStack_380._M_dataplus._M_p = (pointer)&sStack_380.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_380,"bar/foo","");
  bVar2 = WrapSafeFNMatch(&sStack_160,&sStack_380);
  if (bVar2) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_520,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x375);
    poVar5 = google::LogMessage::stream(&LStack_520);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Check failed: !WrapSafeFNMatch(\"bar/foo.ext\", \"bar/foo\") ",0x39);
    if (bVar2) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_520);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_380._M_dataplus._M_p != &sStack_380.field_2) {
    operator_delete(sStack_380._M_dataplus._M_p,sStack_380.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_160._M_dataplus._M_p != &sStack_160.field_2) {
    operator_delete(sStack_160._M_dataplus._M_p,sStack_160.field_2._M_allocated_capacity + 1);
  }
  sStack_180._M_dataplus._M_p = (pointer)&sStack_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_180,"bar/foo.ext","");
  sStack_3a0._M_dataplus._M_p = (pointer)&sStack_3a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_3a0,"bar/foo.ext.zip","");
  bVar2 = WrapSafeFNMatch(&sStack_180,&sStack_3a0);
  if (bVar2) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_530,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x376);
    poVar5 = google::LogMessage::stream(&LStack_530);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Check failed: !WrapSafeFNMatch(\"bar/foo.ext\", \"bar/foo.ext.zip\") ",0x41);
    if (bVar2) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_530);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_3a0._M_dataplus._M_p != &sStack_3a0.field_2) {
    operator_delete(sStack_3a0._M_dataplus._M_p,sStack_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_180._M_dataplus._M_p != &sStack_180.field_2) {
    operator_delete(sStack_180._M_dataplus._M_p,sStack_180.field_2._M_allocated_capacity + 1);
  }
  sStack_1a0._M_dataplus._M_p = (pointer)&sStack_1a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_1a0,"ba?/*.ext","");
  sStack_3c0._M_dataplus._M_p = (pointer)&sStack_3c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_3c0,"bar/foo.ext","");
  bVar2 = WrapSafeFNMatch(&sStack_1a0,&sStack_3c0);
  if (!bVar2) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_540,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x377);
    poVar5 = google::LogMessage::stream(&LStack_540);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Check failed: WrapSafeFNMatch(\"ba?/*.ext\", \"bar/foo.ext\") ",0x3a);
    if (!bVar2) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_540);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_3c0._M_dataplus._M_p != &sStack_3c0.field_2) {
    operator_delete(sStack_3c0._M_dataplus._M_p,sStack_3c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1a0._M_dataplus._M_p != &sStack_1a0.field_2) {
    operator_delete(sStack_1a0._M_dataplus._M_p,sStack_1a0.field_2._M_allocated_capacity + 1);
  }
  sStack_1c0._M_dataplus._M_p = (pointer)&sStack_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_1c0,"ba?/*.ext","");
  sStack_3e0._M_dataplus._M_p = (pointer)&sStack_3e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_3e0,"baZ/FOO.ext","");
  bVar2 = WrapSafeFNMatch(&sStack_1c0,&sStack_3e0);
  if (!bVar2) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_550,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x378);
    poVar5 = google::LogMessage::stream(&LStack_550);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Check failed: WrapSafeFNMatch(\"ba?/*.ext\", \"baZ/FOO.ext\") ",0x3a);
    if (!bVar2) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_550);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_3e0._M_dataplus._M_p != &sStack_3e0.field_2) {
    operator_delete(sStack_3e0._M_dataplus._M_p,sStack_3e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1c0._M_dataplus._M_p != &sStack_1c0.field_2) {
    operator_delete(sStack_1c0._M_dataplus._M_p,sStack_1c0.field_2._M_allocated_capacity + 1);
  }
  sStack_1e0._M_dataplus._M_p = (pointer)&sStack_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_1e0,"ba?/*.ext","");
  sStack_400._M_dataplus._M_p = (pointer)&sStack_400.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_400,"barr/foo.ext","");
  bVar2 = WrapSafeFNMatch(&sStack_1e0,&sStack_400);
  if (bVar2) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_560,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x379);
    poVar5 = google::LogMessage::stream(&LStack_560);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Check failed: !WrapSafeFNMatch(\"ba?/*.ext\", \"barr/foo.ext\") ",0x3c);
    if (bVar2) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_560);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_400._M_dataplus._M_p != &sStack_400.field_2) {
    operator_delete(sStack_400._M_dataplus._M_p,sStack_400.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1e0._M_dataplus._M_p != &sStack_1e0.field_2) {
    operator_delete(sStack_1e0._M_dataplus._M_p,sStack_1e0.field_2._M_allocated_capacity + 1);
  }
  sStack_200._M_dataplus._M_p = (pointer)&sStack_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_200,"ba?/*.ext","");
  sStack_420._M_dataplus._M_p = (pointer)&sStack_420.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_420,"bar/foo.ext2","");
  bVar2 = WrapSafeFNMatch(&sStack_200,&sStack_420);
  if (bVar2) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_570,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x37a);
    poVar5 = google::LogMessage::stream(&LStack_570);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Check failed: !WrapSafeFNMatch(\"ba?/*.ext\", \"bar/foo.ext2\") ",0x3c);
    if (bVar2) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_570);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_420._M_dataplus._M_p != &sStack_420.field_2) {
    operator_delete(sStack_420._M_dataplus._M_p,sStack_420.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_200._M_dataplus._M_p != &sStack_200.field_2) {
    operator_delete(sStack_200._M_dataplus._M_p,sStack_200.field_2._M_allocated_capacity + 1);
  }
  sStack_220._M_dataplus._M_p = (pointer)&sStack_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_220,"ba?/*","");
  sStack_440._M_dataplus._M_p = (pointer)&sStack_440.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_440,"bar/foo.ext2","");
  bVar2 = WrapSafeFNMatch(&sStack_220,&sStack_440);
  if (!bVar2) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_580,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x37b);
    poVar5 = google::LogMessage::stream(&LStack_580);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Check failed: WrapSafeFNMatch(\"ba?/*\", \"bar/foo.ext2\") ",0x37);
    if (!bVar2) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_580);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_440._M_dataplus._M_p != &sStack_440.field_2) {
    operator_delete(sStack_440._M_dataplus._M_p,sStack_440.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_220._M_dataplus._M_p != &sStack_220.field_2) {
    operator_delete(sStack_220._M_dataplus._M_p,sStack_220.field_2._M_allocated_capacity + 1);
  }
  sStack_240._M_dataplus._M_p = (pointer)&sStack_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_240,"ba?/*","");
  sStack_460._M_dataplus._M_p = (pointer)&sStack_460.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_460,"bar/","");
  bVar2 = WrapSafeFNMatch(&sStack_240,&sStack_460);
  if (!bVar2) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_590,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x37c);
    poVar5 = google::LogMessage::stream(&LStack_590);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Check failed: WrapSafeFNMatch(\"ba?/*\", \"bar/\") ",0x2f);
    if (!bVar2) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_590);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_460._M_dataplus._M_p != &sStack_460.field_2) {
    operator_delete(sStack_460._M_dataplus._M_p,sStack_460.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_240._M_dataplus._M_p != &sStack_240.field_2) {
    operator_delete(sStack_240._M_dataplus._M_p,sStack_240.field_2._M_allocated_capacity + 1);
  }
  sStack_260._M_dataplus._M_p = (pointer)&sStack_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_260,"ba?/?","");
  sStack_480._M_dataplus._M_p = (pointer)&sStack_480.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_480,"bar/","");
  bVar2 = WrapSafeFNMatch(&sStack_260,&sStack_480);
  if (bVar2) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_5a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x37d);
    poVar5 = google::LogMessage::stream(&LStack_5a0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Check failed: !WrapSafeFNMatch(\"ba?/?\", \"bar/\") ",0x30);
    if (bVar2) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_5a0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_480._M_dataplus._M_p != &sStack_480.field_2) {
    operator_delete(sStack_480._M_dataplus._M_p,sStack_480.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_260._M_dataplus._M_p != &sStack_260.field_2) {
    operator_delete(sStack_260._M_dataplus._M_p,sStack_260.field_2._M_allocated_capacity + 1);
  }
  sStack_280._M_dataplus._M_p = (pointer)&sStack_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_280,"ba?/*","");
  sStack_4a0._M_dataplus._M_p = (pointer)&sStack_4a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_4a0,"bar","");
  bVar2 = WrapSafeFNMatch(&sStack_280,&sStack_4a0);
  if (bVar2) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_5b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x37e);
    poVar5 = google::LogMessage::stream(&LStack_5b0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Check failed: !WrapSafeFNMatch(\"ba?/*\", \"bar\") ",0x2f);
    if (bVar2) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_5b0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_4a0._M_dataplus._M_p != &sStack_4a0.field_2) {
    operator_delete(sStack_4a0._M_dataplus._M_p,sStack_4a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_280._M_dataplus._M_p != &sStack_280.field_2) {
    operator_delete(sStack_280._M_dataplus._M_p,sStack_280.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(CheckNOTNULL, Simple) {
  int64 t;
  void *ptr = static_cast<void *>(&t);
  void *ref = CHECK_NOTNULL(ptr);
  EXPECT_EQ(ptr, ref);
  CHECK_NOTNULL(reinterpret_cast<char *>(ptr));
  CHECK_NOTNULL(reinterpret_cast<unsigned char *>(ptr));
  CHECK_NOTNULL(reinterpret_cast<int *>(ptr));
  CHECK_NOTNULL(reinterpret_cast<int64 *>(ptr));
}